

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

ostream * gl4cts::anon_unknown_0::operator<<(ostream *stream,imageLoadCall *load)

{
  ostream *poVar1;
  undefined1 local_40 [8];
  imageFormatDetails format_details;
  imageLoadCall *load_local;
  ostream *stream_local;
  
  format_details.m_verification_routine = (verificationRoutine)load;
  ImageLoadStoreMultipleUniformsTest::getImageUniformDeclarationDetails
            (load->m_index,(imageFormatDetails *)local_40);
  poVar1 = std::operator<<(stream,format_details.m_image_type);
  std::operator<<(poVar1," ");
  ImageLoadStoreMultipleUniformsTest::writeLoadedValueVariableNameToStream
            (stream,*(GLuint *)format_details.m_verification_routine);
  std::operator<<(stream," = imageLoad(");
  ImageLoadStoreMultipleUniformsTest::writeImageUniformNameToStream
            (stream,*(GLuint *)format_details.m_verification_routine);
  std::operator<<(stream,", ");
  ImageLoadStoreMultipleUniformsTest::writeCoordinatesVariableNameToStream
            (stream,*(GLuint *)format_details.m_verification_routine,0);
  std::operator<<(stream,");");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const imageLoadCall& load)
	{
		ImageLoadStoreMultipleUniformsTest::imageFormatDetails format_details;
		getImageUniformDeclarationDetails(load.m_index, format_details);

		/* vec4 loaded_value_0 = imageLoad(u_image_0, row_0_coordinates_0); */
		stream << format_details.m_color_type << " ";

		writeLoadedValueVariableNameToStream(stream, load.m_index);

		stream << " = imageLoad(";

		writeImageUniformNameToStream(stream, load.m_index);

		stream << ", ";

		writeCoordinatesVariableNameToStream(stream, load.m_index, 0 /* row */);

		stream << ");";

		return stream;
	}